

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm1394.cpp
# Opt level: O0

bool PromProgramTest(AmpIO *Board)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  void *pvVar4;
  ulong uStack_220;
  int ret;
  size_t i;
  uchar readBuffer [256];
  uchar testBuffer [256];
  AmpIO *Board_local;
  
  for (uStack_220 = 0; uStack_220 < 0x100; uStack_220 = uStack_220 + 1) {
    readBuffer[uStack_220 + 0xf8] = (uchar)uStack_220;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Testing PROM programming");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"  Erasing sector 1E0000 ");
  std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
  FpgaIO::PromSectorErase(&Board->super_FpgaIO,0x1e0000,PromProgramCallback);
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"  Programming first page ");
  std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
  iVar2 = FpgaIO::PromProgramPage
                    (&Board->super_FpgaIO,0x1eff00,readBuffer + 0xf8,0x100,PromProgramCallback);
  if (iVar2 == 0x100) {
    Amp1394_Sleep(0.005);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"  Reading first page ");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    bVar1 = FpgaIO::PromReadData(&Board->super_FpgaIO,0x1eff00,(uint8_t *)&i,0x100);
    if (bVar1) {
      for (uStack_220 = 0; uStack_220 < 0x100; uStack_220 = uStack_220 + 1) {
        if (readBuffer[uStack_220 + 0xf8] != readBuffer[uStack_220 - 8]) {
          poVar3 = std::operator<<((ostream *)&std::cout,"  Mismatch at offset ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,uStack_220);
          poVar3 = std::operator<<(poVar3,": wrote ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)readBuffer[uStack_220 + 0xf8]);
          poVar3 = std::operator<<(poVar3,", read ");
          pvVar4 = (void *)std::ostream::operator<<(poVar3,(uint)readBuffer[uStack_220 - 8]);
          std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
          return false;
        }
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"PROM programming test successful");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      Board_local._7_1_ = true;
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"  Error reading PROM data");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      Board_local._7_1_ = false;
    }
  }
  else {
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"  Cannot program test pattern, ret = ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,iVar2);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    Board_local._7_1_ = false;
  }
  return Board_local._7_1_;
}

Assistant:

bool PromProgramTest(AmpIO &Board)
{
    unsigned char testBuffer[256];
    unsigned char readBuffer[256];
    size_t i;
    for (i = 0; i < sizeof(testBuffer); i++)
        testBuffer[i] = static_cast<unsigned char>(i);

    std::cout << "Testing PROM programming" << std::endl;
    std::cout << "  Erasing sector 1E0000 " << std::flush;
    Board.PromSectorErase(0x1E0000, PromProgramCallback);
    std::cout << std::endl << "  Programming first page " << std::flush;
    int ret = Board.PromProgramPage(0x1EFF00, (uint8_t*)testBuffer, sizeof(testBuffer), PromProgramCallback);
    if (ret != sizeof(testBuffer)) {
        std::cout << std::endl << "  Cannot program test pattern, ret = " << ret << std::endl;
        return false;
    }
    Amp1394_Sleep(0.005);
    std::cout << std::endl << "  Reading first page " << std::endl;
    if (!Board.PromReadData(0x1EFF00, readBuffer, sizeof(readBuffer))) {
        std::cerr << "  Error reading PROM data" << std::endl;
        return false;
    }
    // Compare bytes
    for (i = 0; i < sizeof(testBuffer); i++) {
        if (testBuffer[i] != readBuffer[i]) {
            std::cout << "  Mismatch at offset " << i << ": wrote " << static_cast<unsigned int>(testBuffer[i])
                      << ", read " << static_cast<unsigned int>(readBuffer[i]) << std::endl;
            return false;
        }
    }
    std::cout << "PROM programming test successful" << std::endl;
    return true;
}